

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbePmaReaderIncrMergeInit(PmaReader *pReadr,int eMode)

{
  IncrMerger *pIncr;
  SortSubtask *pTask;
  sqlite3 *db;
  int iVar1;
  sqlite3_file *psVar2;
  i64 nExtend;
  long nExtend_00;
  
  pIncr = pReadr->pIncr;
  pTask = pIncr->pTask;
  db = pTask->pSorter->db;
  iVar1 = vdbeMergeEngineInit(pTask,pIncr->pMerger,eMode);
  if (iVar1 == 0) {
    nExtend_00 = (long)pIncr->mxSz;
    if (pIncr->bUseThread == 0) {
      psVar2 = (pTask->file2).pFd;
      nExtend = (pTask->file2).iEof;
      if (psVar2 == (sqlite3_file *)0x0) {
        iVar1 = vdbeSorterOpenTempFile(db,nExtend,&(pTask->file2).pFd);
        (pTask->file2).iEof = 0;
        if (iVar1 != 0) {
          return iVar1;
        }
        psVar2 = (pTask->file2).pFd;
        nExtend = 0;
      }
      pIncr->aFile[1].pFd = psVar2;
      pIncr->iStartOff = nExtend;
      (pTask->file2).iEof = nExtend_00 + nExtend;
    }
    else {
      iVar1 = vdbeSorterOpenTempFile(db,nExtend_00,&pIncr->aFile[0].pFd);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = vdbeSorterOpenTempFile(db,nExtend_00,&pIncr->aFile[1].pFd);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    if (pIncr->bUseThread == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = vdbeIncrPopulate(pIncr);
    }
    if (eMode != 1 && iVar1 == 0) {
      iVar1 = vdbePmaReaderNext(pReadr);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int vdbePmaReaderIncrMergeInit(PmaReader *pReadr, int eMode){
  int rc = SQLITE_OK;
  IncrMerger *pIncr = pReadr->pIncr;
  SortSubtask *pTask = pIncr->pTask;
  sqlite3 *db = pTask->pSorter->db;

  /* eMode is always INCRINIT_NORMAL in single-threaded mode */
  assert( SQLITE_MAX_WORKER_THREADS>0 || eMode==INCRINIT_NORMAL );

  rc = vdbeMergeEngineInit(pTask, pIncr->pMerger, eMode);

  /* Set up the required files for pIncr. A multi-threaded IncrMerge object
  ** requires two temp files to itself, whereas a single-threaded object
  ** only requires a region of pTask->file2. */
  if( rc==SQLITE_OK ){
    int mxSz = pIncr->mxSz;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pIncr->bUseThread ){
      rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[0].pFd);
      if( rc==SQLITE_OK ){
        rc = vdbeSorterOpenTempFile(db, mxSz, &pIncr->aFile[1].pFd);
      }
    }else
#endif
    /*if( !pIncr->bUseThread )*/{
      if( pTask->file2.pFd==0 ){
        assert( pTask->file2.iEof>0 );
        rc = vdbeSorterOpenTempFile(db, pTask->file2.iEof, &pTask->file2.pFd);
        pTask->file2.iEof = 0;
      }
      if( rc==SQLITE_OK ){
        pIncr->aFile[1].pFd = pTask->file2.pFd;
        pIncr->iStartOff = pTask->file2.iEof;
        pTask->file2.iEof += mxSz;
      }
    }
  }

#if SQLITE_MAX_WORKER_THREADS>0
  if( rc==SQLITE_OK && pIncr->bUseThread ){
    /* Use the current thread to populate aFile[1], even though this
    ** PmaReader is multi-threaded. If this is an INCRINIT_TASK object,
    ** then this function is already running in background thread
    ** pIncr->pTask->thread.
    **
    ** If this is the INCRINIT_ROOT object, then it is running in the
    ** main VDBE thread. But that is Ok, as that thread cannot return
    ** control to the VDBE or proceed with anything useful until the
    ** first results are ready from this merger object anyway.
    */
    assert( eMode==INCRINIT_ROOT || eMode==INCRINIT_TASK );
    rc = vdbeIncrPopulate(pIncr);
  }
#endif

  if( rc==SQLITE_OK && (SQLITE_MAX_WORKER_THREADS==0 || eMode!=INCRINIT_TASK) ){
    rc = vdbePmaReaderNext(pReadr);
  }

  return rc;
}